

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::
       MessageSizeNoVirtual<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
                 (ItemSimilarityRecommender_SimilarItems *value)

{
  size_t sVar1;
  ItemSimilarityRecommender_SimilarItems *value_local;
  
  sVar1 = CoreML::Specification::ItemSimilarityRecommender_SimilarItems::ByteSizeLong(value);
  sVar1 = LengthDelimitedSize(sVar1);
  return sVar1;
}

Assistant:

inline size_t WireFormatLite::MessageSizeNoVirtual(
    const MessageType_WorkAroundCppLookupDefect& value) {
  return LengthDelimitedSize(
      value.MessageType_WorkAroundCppLookupDefect::ByteSizeLong());
}